

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O1

void * alsa_update_rw(ALLEGRO_THREAD *self,void *arg)

{
  ALLEGRO_AUDIO_DEPTH depth;
  ALLEGRO_CHANNEL_CONF chan_conf;
  uint *puVar1;
  ALLEGRO_MUTEX *mutex;
  int iVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined1 *puVar9;
  undefined1 *buf_00;
  uint samples;
  ulong uVar10;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  undefined1 *local_48;
  void *buf;
  uint local_38;
  int bytes;
  uint iframes;
  
  puVar9 = auStack_58;
  puVar1 = *(uint **)((long)arg + 0x50);
  cVar3 = _al_trace_prefix("alsa",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1a5,"alsa_update_rw");
  if (cVar3 != '\0') {
    _al_trace_suffix("ALSA update_rw thread started\n");
  }
  cVar3 = al_get_thread_should_stop(self);
  if (cVar3 == '\0') {
    bytes = -1;
    puVar9 = auStack_58;
    do {
      while( true ) {
        if ((*(char *)((long)puVar1 + 0x11) == '\x01') && (*(char *)((long)puVar1 + 0x12) == '\0'))
        {
          uVar8 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(puVar9 + -8) = 0x110d05;
          snd_pcm_drop(uVar8);
          uVar8 = *(undefined8 *)((long)arg + 0x30);
          *(undefined8 *)(puVar9 + -8) = 0x110d0e;
          al_lock_mutex(uVar8);
          *(undefined1 *)((long)puVar1 + 0x12) = 1;
          uVar8 = *(undefined8 *)((long)arg + 0x38);
          *(undefined8 *)(puVar9 + -8) = 0x110d1c;
          al_signal_cond(uVar8);
          uVar8 = *(undefined8 *)((long)arg + 0x30);
          *(undefined8 *)(puVar9 + -8) = 0x110d25;
          al_unlock_mutex(uVar8);
        }
        if ((*(char *)((long)puVar1 + 0x11) == '\0') && (*(char *)((long)puVar1 + 0x12) == '\x01'))
        {
          *(undefined1 *)((long)puVar1 + 0x12) = 0;
        }
        if (*(char *)((long)puVar1 + 0x12) == '\x01') break;
        uVar8 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)(puVar9 + -8) = 0x110d99;
        iVar4 = snd_pcm_state(uVar8);
        iVar2 = bytes;
        if (iVar4 != bytes) {
          *(undefined8 *)(puVar9 + -8) = 0x110dbe;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1c1,"alsa_update_rw");
          iVar2 = iVar4;
          if (cVar3 != '\0') {
            *(undefined8 *)(puVar9 + -8) = 0x110dca;
            snd_pcm_state_name(iVar4);
            *(undefined8 *)(puVar9 + -8) = 0x110ddb;
            _al_trace_suffix("state changed to: %s\n");
          }
        }
        bytes = iVar2;
        if (iVar4 == 2) {
          uVar8 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(puVar9 + -8) = 0x110e3f;
          uVar5 = snd_pcm_start(uVar8);
          *(undefined8 *)(puVar9 + -8) = 0x110e5f;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1cb,"alsa_update_rw");
          if (cVar3 != '\0') {
            *(undefined8 *)(puVar9 + -8) = 0x110e74;
            _al_trace_suffix("snd_pcm_start returned: %d\n",uVar5);
          }
LAB_00110e74:
          uVar8 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(puVar9 + -8) = 0x110e82;
          snd_pcm_wait(uVar8);
          uVar8 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(puVar9 + -8) = 0x110e8b;
          uVar6 = snd_pcm_avail_update(uVar8);
          if ((long)uVar6 < 0) {
            if (uVar6 != 0xffffffffffffffe0) {
              *(undefined8 *)(puVar9 + -8) = 0x110fb1;
              cVar3 = _al_trace_prefix("alsa",2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                       ,0x1d5,"alsa_update_rw");
              if (cVar3 != '\0') {
                *(undefined8 *)(puVar9 + -8) = 0x110fc4;
                uVar8 = snd_strerror(-(int)uVar6);
                *(undefined8 *)(puVar9 + -8) = 0x110fd5;
                _al_trace_suffix("Alsa r/w thread exited with error code %s.\n",uVar8);
              }
              goto LAB_00110c98;
            }
            uVar8 = *(undefined8 *)(puVar1 + 0xc);
            *(undefined8 *)(puVar9 + -8) = 0x110ea6;
            snd_pcm_prepare(uVar8);
          }
          if (uVar6 != 0) {
            uVar10 = *(ulong *)(puVar1 + 2);
            if (uVar6 < *(ulong *)(puVar1 + 2)) {
              uVar10 = uVar6;
            }
            samples = (uint)uVar10;
            buf._4_4_ = *puVar1 * samples;
            buf_00 = puVar9 + -((ulong)buf._4_4_ + 0xf & 0xfffffffffffffff0);
            local_50 = puVar9;
            if (*(char *)((long)arg + 0x28) == '\0') {
              if (*(char *)((long)puVar1 + 0x12) != '\0') goto LAB_00110f1c;
              *(undefined8 *)(buf_00 + -8) = 0x110f42;
              alsa_update_nonstream_voice((ALLEGRO_VOICE *)arg,&local_48,(int *)((long)&buf + 4));
              uVar6 = (ulong)buf._4_4_ / (ulong)*puVar1;
            }
            else {
              if (*(char *)((long)puVar1 + 0x12) == '\0') {
                mutex = *(ALLEGRO_MUTEX **)((long)arg + 0x30);
                local_38 = samples;
                *(undefined8 *)(buf_00 + -8) = 0x110eff;
                local_48 = (undefined1 *)_al_voice_update((ALLEGRO_VOICE *)arg,mutex,&local_38);
                uVar6 = (ulong)local_38;
                if (local_48 != (undefined1 *)0x0) goto LAB_00110f4e;
              }
LAB_00110f1c:
              depth = *arg;
              chan_conf = *(ALLEGRO_CHANNEL_CONF *)((long)arg + 4);
              *(undefined8 *)(buf_00 + -8) = 0x110f2c;
              al_fill_silence(buf_00,samples,depth,chan_conf);
              uVar6 = uVar10;
              local_48 = buf_00;
            }
LAB_00110f4e:
            puVar9 = local_48;
            uVar8 = *(undefined8 *)(puVar1 + 0xc);
            *(undefined8 *)(buf_00 + -8) = 0x110f5e;
            lVar7 = snd_pcm_writei(uVar8,puVar9,uVar6);
            puVar9 = local_50;
            if (lVar7 == -0x20) {
              uVar8 = *(undefined8 *)(puVar1 + 0xc);
              *(undefined8 *)(buf_00 + -8) = 0x110f6d;
              snd_pcm_prepare(uVar8);
              puVar9 = local_50;
            }
          }
        }
        else {
          if (iVar4 != 1) goto LAB_00110e74;
          uVar8 = *(undefined8 *)(puVar1 + 0xc);
          *(undefined8 *)(puVar9 + -8) = 0x110df8;
          snd_pcm_prepare(uVar8);
          *(undefined8 *)(puVar9 + -8) = 0x110e18;
          cVar3 = _al_trace_prefix("alsa",0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1c6,"alsa_update_rw");
          if (cVar3 != '\0') {
            *(undefined8 *)(puVar9 + -8) = 0x110e31;
            _al_trace_suffix("snd_pcm_prepare returned: %d\n");
          }
        }
        *(undefined8 *)(puVar9 + -8) = 0x110f79;
        cVar3 = al_get_thread_should_stop(self);
        if (cVar3 != '\0') goto LAB_00110c98;
      }
      uVar8 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)(puVar9 + -8) = 0x110d4a;
      al_lock_mutex(uVar8);
      if (*(char *)((long)puVar1 + 0x11) == '\x01') {
        do {
          *(undefined8 *)(puVar9 + -8) = 0x110d5a;
          cVar3 = al_get_thread_should_stop(self);
          if (cVar3 != '\0') break;
          uVar8 = *(undefined8 *)((long)arg + 0x38);
          *(undefined8 *)(puVar9 + -8) = 0x110d6b;
          al_wait_cond(uVar8);
        } while (*(char *)((long)puVar1 + 0x11) != '\0');
      }
      uVar8 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)(puVar9 + -8) = 0x110d7b;
      al_unlock_mutex(uVar8);
      *(undefined8 *)(puVar9 + -8) = 0x110d83;
      cVar3 = al_get_thread_should_stop(self);
    } while (cVar3 == '\0');
  }
LAB_00110c98:
  *(undefined8 *)(puVar9 + -8) = 0x110cbc;
  cVar3 = _al_trace_prefix("alsa",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1ff,"alsa_update_rw");
  if (cVar3 != '\0') {
    *(undefined8 *)(puVar9 + -8) = 0x110cce;
    _al_trace_suffix("ALSA update_rw thread stopped\n");
  }
  return (void *)0x0;
}

Assistant:

static void *alsa_update_rw(ALLEGRO_THREAD *self, void *arg)
{
   ALLEGRO_VOICE *voice = (ALLEGRO_VOICE*)arg;
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   snd_pcm_state_t last_state = -1;
   snd_pcm_state_t state;
   snd_pcm_uframes_t frames;
   snd_pcm_sframes_t err;

   ALLEGRO_INFO("ALSA update_rw thread started\n");

   while (!al_get_thread_should_stop(self)) {
      if (alsa_voice->stop && !alsa_voice->stopped) {
         snd_pcm_drop(alsa_voice->pcm_handle);
         al_lock_mutex(voice->mutex);
         alsa_voice->stopped = true;
         al_signal_cond(voice->cond);
         al_unlock_mutex(voice->mutex);
      }

      if (!alsa_voice->stop && alsa_voice->stopped) {
         alsa_voice->stopped = false;
      }

      if (alsa_voice->stopped) {
         /* Keep waiting while the voice is supposed to be stopped but present.
          */
         al_lock_mutex(voice->mutex);
         while (alsa_voice->stop && !al_get_thread_should_stop(self)) {
            al_wait_cond(voice->cond, voice->mutex);
         }
         al_unlock_mutex(voice->mutex);
         continue;
      }

      state = snd_pcm_state(alsa_voice->pcm_handle);
      if (state != last_state) {
         ALLEGRO_DEBUG("state changed to: %s\n", snd_pcm_state_name(state));
         last_state = state;
      }
      if (state == SND_PCM_STATE_SETUP) {
         int rc = snd_pcm_prepare(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_prepare returned: %d\n", rc);
         continue;
      }
      if (state == SND_PCM_STATE_PREPARED) {
         int rc = snd_pcm_start(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_start returned: %d\n", rc);
      }

      snd_pcm_wait(alsa_voice->pcm_handle, 10);
      err = snd_pcm_avail_update(alsa_voice->pcm_handle);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
         else {
            ALLEGRO_WARN("Alsa r/w thread exited "
               "with error code %s.\n", snd_strerror(-err));
            break;
         }
      }
      if (err == 0) {
         continue;
      }
      frames = err;
      if (frames > alsa_voice->frag_len)
         frames = alsa_voice->frag_len;
      /* Write sample data into the buffer. */
      int bytes = frames * alsa_voice->frame_size;
      uint8_t data[bytes];
      void *buf;
      if (!voice->is_streaming && !alsa_voice->stopped) {
         ASSERT(!alsa_voice->reversed); // FIXME
         alsa_update_nonstream_voice(voice, &buf, &bytes);
         frames = bytes / alsa_voice->frame_size;
      }
      else if (voice->is_streaming && !alsa_voice->stopped) {
         /* This should fit. */
         unsigned int iframes = frames;
         buf = (void *)_al_voice_update(voice, voice->mutex, &iframes);
         if (buf == NULL)
            goto silence;
         frames = iframes;
      }
      else {
silence:
         /* If stopped just fill with silence. */
         al_fill_silence(data, frames, voice->depth, voice->chan_conf);
         buf = data;
      }
      err = snd_pcm_writei(alsa_voice->pcm_handle, buf, frames);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
      }
   }

   ALLEGRO_INFO("ALSA update_rw thread stopped\n");

   return NULL;
}